

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_internal.c
# Opt level: O2

void http_lib_cleanup(void *ignr_)

{
  http_mimetype_clear();
  fiobj_free(HTTP_HEADER_ACCEPT);
  HTTP_HEADER_ACCEPT = 0;
  fiobj_free(HTTP_HEADER_ACCEPT_RANGES);
  HTTP_HEADER_ACCEPT_RANGES = 0;
  fiobj_free(HTTP_HEADER_CACHE_CONTROL);
  HTTP_HEADER_CACHE_CONTROL = 0;
  fiobj_free(HTTP_HEADER_CONNECTION);
  HTTP_HEADER_CONNECTION = 0;
  fiobj_free(HTTP_HEADER_CONTENT_ENCODING);
  HTTP_HEADER_CONTENT_ENCODING = 0;
  fiobj_free(HTTP_HEADER_CONTENT_LENGTH);
  HTTP_HEADER_CONTENT_LENGTH = 0;
  fiobj_free(HTTP_HEADER_CONTENT_RANGE);
  HTTP_HEADER_CONTENT_RANGE = 0;
  fiobj_free(HTTP_HEADER_CONTENT_TYPE);
  HTTP_HEADER_CONTENT_TYPE = 0;
  fiobj_free(HTTP_HEADER_COOKIE);
  HTTP_HEADER_COOKIE = 0;
  fiobj_free(HTTP_HEADER_DATE);
  HTTP_HEADER_DATE = 0;
  fiobj_free(HTTP_HEADER_ETAG);
  HTTP_HEADER_ETAG = 0;
  fiobj_free(HTTP_HEADER_HOST);
  HTTP_HEADER_HOST = 0;
  fiobj_free(HTTP_HEADER_LAST_MODIFIED);
  HTTP_HEADER_LAST_MODIFIED = 0;
  fiobj_free(HTTP_HEADER_ORIGIN);
  HTTP_HEADER_ORIGIN = 0;
  fiobj_free(HTTP_HEADER_SET_COOKIE);
  HTTP_HEADER_SET_COOKIE = 0;
  fiobj_free(HTTP_HEADER_UPGRADE);
  HTTP_HEADER_UPGRADE = 0;
  fiobj_free(HTTP_HEADER_WS_SEC_CLIENT_KEY);
  HTTP_HEADER_WS_SEC_CLIENT_KEY = 0;
  fiobj_free(HTTP_HEADER_WS_SEC_KEY);
  HTTP_HEADER_WS_SEC_KEY = 0;
  fiobj_free(HTTP_HVALUE_BYTES);
  HTTP_HVALUE_BYTES = 0;
  fiobj_free(HTTP_HVALUE_CLOSE);
  HTTP_HVALUE_CLOSE = 0;
  fiobj_free(HTTP_HVALUE_CONTENT_TYPE_DEFAULT);
  HTTP_HVALUE_CONTENT_TYPE_DEFAULT = 0;
  fiobj_free(HTTP_HVALUE_GZIP);
  HTTP_HVALUE_GZIP = 0;
  fiobj_free(HTTP_HVALUE_KEEP_ALIVE);
  HTTP_HVALUE_KEEP_ALIVE = 0;
  fiobj_free(HTTP_HVALUE_MAX_AGE);
  HTTP_HVALUE_MAX_AGE = 0;
  fiobj_free(HTTP_HVALUE_NO_CACHE);
  HTTP_HVALUE_NO_CACHE = 0;
  fiobj_free(HTTP_HVALUE_SSE_MIME);
  HTTP_HVALUE_SSE_MIME = 0;
  fiobj_free(HTTP_HVALUE_WEBSOCKET);
  HTTP_HVALUE_WEBSOCKET = 0;
  fiobj_free(HTTP_HVALUE_WS_SEC_VERSION);
  HTTP_HVALUE_WS_SEC_VERSION = 0;
  fiobj_free(HTTP_HVALUE_WS_UPGRADE);
  HTTP_HVALUE_WS_UPGRADE = 0;
  fiobj_free(HTTP_HVALUE_WS_VERSION);
  HTTP_HVALUE_WS_VERSION = 0;
  http_mimetype_stats();
  return;
}

Assistant:

static void http_lib_cleanup(void *ignr_) {
  (void)ignr_;
  http_mimetype_clear();
#define HTTPLIB_RESET(x)                                                       \
  fiobj_free(x);                                                               \
  x = FIOBJ_INVALID;
  HTTPLIB_RESET(HTTP_HEADER_ACCEPT);
  HTTPLIB_RESET(HTTP_HEADER_ACCEPT_RANGES);
  HTTPLIB_RESET(HTTP_HEADER_CACHE_CONTROL);
  HTTPLIB_RESET(HTTP_HEADER_CONNECTION);
  HTTPLIB_RESET(HTTP_HEADER_CONTENT_ENCODING);
  HTTPLIB_RESET(HTTP_HEADER_CONTENT_LENGTH);
  HTTPLIB_RESET(HTTP_HEADER_CONTENT_RANGE);
  HTTPLIB_RESET(HTTP_HEADER_CONTENT_TYPE);
  HTTPLIB_RESET(HTTP_HEADER_COOKIE);
  HTTPLIB_RESET(HTTP_HEADER_DATE);
  HTTPLIB_RESET(HTTP_HEADER_ETAG);
  HTTPLIB_RESET(HTTP_HEADER_HOST);
  HTTPLIB_RESET(HTTP_HEADER_LAST_MODIFIED);
  HTTPLIB_RESET(HTTP_HEADER_ORIGIN);
  HTTPLIB_RESET(HTTP_HEADER_SET_COOKIE);
  HTTPLIB_RESET(HTTP_HEADER_UPGRADE);
  HTTPLIB_RESET(HTTP_HEADER_WS_SEC_CLIENT_KEY);
  HTTPLIB_RESET(HTTP_HEADER_WS_SEC_KEY);
  HTTPLIB_RESET(HTTP_HVALUE_BYTES);
  HTTPLIB_RESET(HTTP_HVALUE_CLOSE);
  HTTPLIB_RESET(HTTP_HVALUE_CONTENT_TYPE_DEFAULT);
  HTTPLIB_RESET(HTTP_HVALUE_GZIP);
  HTTPLIB_RESET(HTTP_HVALUE_KEEP_ALIVE);
  HTTPLIB_RESET(HTTP_HVALUE_MAX_AGE);
  HTTPLIB_RESET(HTTP_HVALUE_NO_CACHE);
  HTTPLIB_RESET(HTTP_HVALUE_SSE_MIME);
  HTTPLIB_RESET(HTTP_HVALUE_WEBSOCKET);
  HTTPLIB_RESET(HTTP_HVALUE_WS_SEC_VERSION);
  HTTPLIB_RESET(HTTP_HVALUE_WS_UPGRADE);
  HTTPLIB_RESET(HTTP_HVALUE_WS_VERSION);

#undef HTTPLIB_RESET
  http_mimetype_stats();
}